

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

void immutable::rrb_details::promote_rightmost_leaf<int,false,6>
               (ref<immutable::rrb<int,_false,_6>_> *new_rrb)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar2;
  uint32_t *puVar3;
  ref<immutable::rrb<int,_false,_6>_> *this;
  rrb<int,_false,_6> *prVar4;
  internal_node<int,_false> *piVar5;
  rrb_size_table<false> *prVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar10;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar11;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  ref<immutable::rrb<int,_false,_6>_> *local_80;
  uint32_t uStack_74;
  long local_70;
  ref<immutable::rrb_details::internal_node<int,_false>_> path [7];
  
  path[4].ptr = (internal_node<int,_false> *)0x0;
  path[5].ptr = (internal_node<int,_false> *)0x0;
  path[2].ptr = (internal_node<int,_false> *)0x0;
  path[3].ptr = (internal_node<int,_false> *)0x0;
  path[0].ptr = (internal_node<int,_false> *)0x0;
  path[1].ptr = (internal_node<int,_false> *)0x0;
  path[6].ptr = (internal_node<int,_false> *)0x0;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
  ref<immutable::rrb_details::internal_node<int,false>>::operator=
            ((ref<immutable::rrb_details::internal_node<int,false>> *)path,&prVar4->root);
  uVar7 = 0;
  uVar9 = 0;
  local_80 = new_rrb;
  while( true ) {
    prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(local_80);
    this = local_80;
    prVar11 = path + uVar7;
    if (prVar4->shift <= uVar9) break;
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar11);
    prVar10 = piVar5->child;
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar11);
    uVar7 = (ulong)((int)uVar7 + 1);
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
              (path + uVar7,prVar10 + (piVar5->len - 1));
    uVar9 = uVar9 + 6;
  }
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(local_80);
  ref<immutable::rrb_details::leaf_node<int,false>>::operator=
            ((ref<immutable::rrb_details::leaf_node<int,false>> *)&prVar4->tail,prVar11);
  piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar11);
  uVar1 = piVar5->len;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(this);
  prVar4->tail_len = uVar1;
  prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(this);
  uStack_74 = prVar4->tail_len;
  local_88.ptr = (internal_node<int,_false> *)0x0;
  ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar11,&local_88);
  ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_88);
  local_70 = uVar7 * 8 + -8;
  lVar8 = 0;
  prVar11 = path;
  do {
    if (uVar7 * 8 == lVar8) {
      prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(local_80);
      ref<immutable::rrb_details::tree_node<int,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar4->root,path);
      lVar8 = 0x30;
      do {
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&path[0].ptr + lVar8));
        lVar8 = lVar8 + -8;
      } while (lVar8 != -8);
      return;
    }
    prVar10 = prVar11 + uVar7 + -1;
    if (prVar11[uVar7].ptr == (internal_node<int,_false> *)0x0) {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
      if (piVar5->len == 1) {
        local_88.ptr = (internal_node<int,_false> *)0x0;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar10,&local_88);
      }
      else {
        if (local_70 == lVar8) {
          piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
          if (piVar5->len == 2) {
            piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                      (prVar10,piVar5->child);
            prVar4 = ref<immutable::rrb<int,_false,_6>_>::operator->(local_80);
            prVar4->shift = prVar4->shift - 6;
            goto LAB_00144ee7;
          }
        }
        local_88.ptr = internal_node_dec<int,false>(prVar10->ptr);
        if (local_88.ptr != (internal_node<int,_false> *)0x0) {
          (local_88.ptr)->_ref_count = 1;
        }
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar10,&local_88);
      }
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_88);
    }
    else {
      local_88.ptr = internal_node_clone<int,false>(prVar11[uVar7 - 1].ptr);
      if (local_88.ptr != (internal_node<int,_false> *)0x0) {
        (local_88.ptr)->_ref_count = 1;
      }
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar10,&local_88);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_88);
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
      prVar2 = piVar5->child;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                (prVar2 + (piVar5->len - 1),prVar11 + uVar7);
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
      if ((piVar5->size_table).ptr != (rrb_size_table<false> *)0x0) {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
        prVar6 = (piVar5->size_table).ptr;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
        local_88.ptr = (internal_node<int,_false> *)size_table_clone<false>(prVar6,piVar5->len);
        if (local_88.ptr != (internal_node<int,_false> *)0x0) {
          (local_88.ptr)->_ref_count = 1;
        }
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_88);
        release((rrb_size_table<false> *)local_88.ptr);
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
        prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           (&piVar5->size_table);
        puVar3 = prVar6->size;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(prVar10);
        puVar3[piVar5->len - 1] = puVar3[piVar5->len - 1] - uStack_74;
      }
    }
LAB_00144ee7:
    lVar8 = lVar8 + 8;
    prVar11 = prVar11 + -1;
  } while( true );
}

Assistant:

inline void promote_rightmost_leaf(ref<rrb<T, atomic_ref_counting, N>>& new_rrb)
      {
      ref<internal_node<T, atomic_ref_counting>> path[bits<N>::rrb_max_height + 1];
      path[0] = new_rrb->root;
      uint32_t i = 0, shift = 0;

      // populate path array
      for (i = 0, shift = 0; shift < new_rrb->shift; i++, shift += bits<N>::rrb_bits)
        {
        path[i + 1] = path[i]->child[path[i]->len - 1];
        }

      const uint32_t height = i;
      // Set the leaf node as tail.
      new_rrb->tail = path[height];
      new_rrb->tail_len = path[height]->len;
      const uint32_t tail_len = new_rrb->tail_len;

      // last element is now always null, in contrast to direct pop
      path[height] = ref<internal_node<T, atomic_ref_counting>>(nullptr);

      while (i-- > 0)
        {
        // TODO: First skip will always happen. Can we use that somehow?
        if (path[i + 1].ptr == nullptr)
          {
          if (path[i]->len == 1)
            {
            path[i] = ref<internal_node<T, atomic_ref_counting>>(nullptr);
            }
          else if (i == 0 && path[i]->len == 2)
            {
            path[i] = path[i]->child[0];
            new_rrb->shift -= bits<N>::rrb_bits;
            }
          else
            {
            path[i] = internal_node_dec(path[i].ptr);
            }
          }
        else
          {
          path[i] = internal_node_clone(path[i].ptr);
          path[i]->child[path[i]->len - 1] = path[i + 1];
          if (path[i]->size_table.ptr != nullptr)
            {
            path[i]->size_table = size_table_clone(path[i]->size_table.ptr, path[i]->len);
            // this line differs, as we remove `tail_len` elements from the trie,
            // instead of just 1 as in the direct pop algorithm.
            path[i]->size_table->size[path[i]->len - 1] -= tail_len;
            }
          }
        }

      new_rrb->root = path[0];
      }